

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.h
# Opt level: O0

void __thiscall
mp::BasicExprFactory<std::allocator<char>_>::
BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>_>
::AddArg(BasicIteratedExprBuilder<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)48,_(mp::expr::Kind)69>,_(mp::expr::Kind)47,_(mp::expr::Kind)47>_>
         *this,Arg arg)

{
  long lVar1;
  Impl *pIVar2;
  long *in_RDI;
  ExprBase local_8;
  
  pIVar2 = internal::ExprBase::impl(&local_8);
  lVar1 = in_RDI[1];
  *(int *)(in_RDI + 1) = (int)lVar1 + 1;
  *(Impl **)(*in_RDI + 8 + (long)(int)lVar1 * 8) = pIVar2;
  return;
}

Assistant:

void AddArg(typename ExprType::Arg arg) {
      MP_ASSERT(arg_index_ < impl_->num_args, "too many arguments");
      MP_ASSERT(arg != 0, "invalid argument");
      impl_->args[arg_index_++] = arg.impl();
    }